

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proc.cpp
# Opt level: O0

string * __thiscall
yactfr::internal::SaveValInstr::_toStr_abi_cxx11_
          (string *__return_storage_ptr__,SaveValInstr *this,Size param_1)

{
  ostream *poVar1;
  allocator local_1e9;
  string local_1e8;
  string local_1c8;
  ostringstream local_198 [8];
  ostringstream ss;
  Size param_1_local;
  SaveValInstr *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  poVar1 = std::operator<<((ostream *)local_198," ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1e8,"pos",&local_1e9);
  _strProp(&local_1c8,&local_1e8);
  poVar1 = std::operator<<(poVar1,(string *)&local_1c8);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->_pos);
  poVar1 = std::operator<<(poVar1," ");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return __return_storage_ptr__;
}

Assistant:

std::string SaveValInstr::_toStr(Size) const
{
    std::ostringstream ss;

    ss << " " << _strProp("pos") << _pos << " " << std::endl;
    return ss.str();
}